

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesCMakeVariable(cmFindPackageCommand *this)

{
  mapped_type *this_00;
  allocator<char> local_29;
  string local_28;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_PREFIX_PATH",&local_29);
  cmSearchPath::AddCMakePath(this_00,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_FRAMEWORK_PATH",&local_29);
  cmSearchPath::AddCMakePath(this_00,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_APPBUNDLE_PATH",&local_29);
  cmSearchPath::AddCMakePath(this_00,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMake];

  paths.AddCMakePath("CMAKE_PREFIX_PATH");
  paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
}